

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_playback(Pager *pPager,int isHot)

{
  i64 *pOffset;
  sqlite3_vfs *psVar1;
  char *pcVar2;
  ulong uVar3;
  u64 n;
  u32 uVar4;
  long lVar5;
  u32 uVar6;
  sqlite3_file *pJrnl;
  int iVar7;
  int iVar8;
  sqlite3_file *__s;
  undefined4 *puVar9;
  size_t sVar10;
  ulong uVar11;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  bool bVar15;
  int res;
  u32 nRec;
  i64 nSuperJournal;
  Pgno mxPg;
  i64 szJ;
  u32 savedPageSize;
  int local_90;
  int local_80;
  u32 local_7c;
  long local_78;
  undefined4 *local_70;
  int local_68;
  u32 local_64;
  ulong local_60;
  char *local_58;
  char *local_50;
  u32 local_48;
  int local_44;
  long local_40;
  sqlite3_file *local_38;
  
  psVar1 = pPager->pVfs;
  local_64 = 0;
  local_80 = 1;
  local_48 = (u32)pPager->pageSize;
  iVar7 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_60);
  uVar14 = 0;
  if (iVar7 == 0) {
    pcVar2 = pPager->pTmpSpace;
    iVar7 = readSuperJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
    if (iVar7 == 0) {
      iVar7 = 0;
      if (*pcVar2 != '\0') {
        iVar7 = (*psVar1->xAccess)(psVar1,pcVar2,0,&local_80);
      }
      uVar14 = 0;
      if ((iVar7 == 0) && (uVar14 = 0, local_80 != 0)) {
        pOffset = &pPager->journalOff;
        pPager->journalOff = 0;
        uVar14 = 0;
        local_90 = isHot;
LAB_0012ee14:
        iVar7 = readJournalHdr(pPager,isHot,local_60,&local_7c,&local_64);
        uVar6 = local_64;
        if (iVar7 == 0) {
          uVar11 = (ulong)pPager->sectorSize;
          if (local_7c == 0xffffffff) {
            local_7c = (u32)((long)(local_60 - uVar11) / (pPager->pageSize + 8));
          }
          uVar3 = *pOffset;
          if ((local_7c == 0 && isHot == 0) && (pPager->journalHdr + uVar11 == uVar3)) {
            local_7c = (u32)((long)(local_60 - uVar3) / (pPager->pageSize + 8));
          }
          uVar4 = local_7c;
          if (uVar3 == uVar11) {
            iVar7 = pager_truncate(pPager,local_64);
            if (iVar7 != 0) goto LAB_0012ed7e;
            pPager->dbSize = uVar6;
            if (pPager->mxPgno < uVar6) {
              pPager->mxPgno = uVar6;
            }
          }
          if (uVar4 != 0) {
            bVar15 = local_90 == 0;
            iVar12 = 0;
            do {
              if (!bVar15) {
                pager_reset(pPager);
              }
              iVar7 = pager_playback_one_page(pPager,pOffset,(Bitvec *)0x0,1,0);
              if (iVar7 != 0) {
                if (iVar7 != 0x65) {
                  uVar14 = uVar14 - iVar12;
                  if (iVar7 != 0x20a) goto LAB_0012ef64;
                  goto LAB_0012ef6d;
                }
                *pOffset = local_60;
                uVar14 = uVar14 - iVar12;
                local_90 = 0;
                goto LAB_0012ee14;
              }
              iVar12 = iVar12 + -1;
              bVar15 = true;
            } while (-uVar4 != iVar12);
            local_90 = 0;
            uVar14 = uVar14 + uVar4;
          }
          goto LAB_0012ee14;
        }
        if (iVar7 == 0x65) goto LAB_0012ef6d;
      }
      else {
LAB_0012ef64:
        if (iVar7 == 0) {
LAB_0012ef6d:
          iVar7 = sqlite3PagerSetPagesize(pPager,&local_48,-1);
          pPager->changeCountDone = pPager->tempFile;
          if (iVar7 != 0) goto LAB_0012ed84;
          pcVar13 = pPager->pTmpSpace;
          pcVar2 = pcVar13 + 4;
          iVar7 = readSuperJournal(pPager->jfd,pcVar2,pPager->pVfs->mxPathname + 1);
          if ((iVar7 != 0) ||
             (((byte)(pPager->eState - 4) < 0xfd &&
              (iVar7 = sqlite3PagerSync(pPager,(char *)0x0), iVar7 != 0)))) goto LAB_0012ed84;
          iVar7 = pager_end_transaction(pPager,(uint)(*pcVar2 != '\0'),0);
          if ((iVar7 != 0) || ((iVar7 = 0, *pcVar2 == '\0' || (local_80 == 0)))) goto LAB_0012ed84;
          pcVar13[0] = '\0';
          pcVar13[1] = '\0';
          pcVar13[2] = '\0';
          pcVar13[3] = '\0';
          psVar1 = pPager->pVfs;
          n = (long)psVar1->szOsFile * 2;
          __s = (sqlite3_file *)sqlite3Malloc(n);
          if (__s == (sqlite3_file *)0x0) {
            iVar7 = 7;
            goto LAB_0012ed84;
          }
          memset(__s,0,n);
          iVar7 = (*psVar1->xOpen)(psVar1,pcVar2,__s,0x4001,(int *)0x0);
          if (iVar7 == 0) {
            iVar12 = psVar1->szOsFile;
            iVar7 = (*__s->pMethods->xFileSize)(__s,&local_78);
            if (iVar7 == 0) {
              local_40 = (long)psVar1->mxPathname;
              puVar9 = (undefined4 *)sqlite3Malloc(local_78 + local_40 + 7);
              lVar5 = local_78;
              if (puVar9 != (undefined4 *)0x0) {
                local_50 = (char *)(puVar9 + 1);
                *puVar9 = 0;
                local_70 = puVar9;
                iVar7 = (*__s->pMethods->xRead)(__s,local_50,(int)local_78,0);
                puVar9 = local_70;
                if (iVar7 == 0) {
                  local_50[local_78] = '\0';
                  local_50[local_78 + 1] = '\0';
                  if (0 < local_78) {
                    local_38 = (sqlite3_file *)((long)&__s->pMethods + (long)iVar12);
                    local_40 = local_40 + 1;
                    local_58 = (char *)((long)local_70 + lVar5 + 6);
                    pcVar13 = local_50;
                    do {
                      iVar12 = (*psVar1->xAccess)(psVar1,pcVar13,0,&local_44);
                      pJrnl = local_38;
                      iVar7 = iVar12;
                      if (iVar12 != 0) {
LAB_0012f2ae:
                        sqlite3_free(local_70);
                        goto LAB_0012f116;
                      }
                      if (local_44 != 0) {
                        iVar7 = (*psVar1->xOpen)(psVar1,pcVar13,local_38,0x4001,(int *)0x0);
                        if (iVar7 == 0) {
                          local_68 = readSuperJournal(pJrnl,local_58,(u32)local_40);
                          if (pJrnl->pMethods != (sqlite3_io_methods *)0x0) {
                            (*pJrnl->pMethods->xClose)(pJrnl);
                            pJrnl->pMethods = (sqlite3_io_methods *)0x0;
                          }
                          iVar7 = local_68;
                          if ((local_68 == 0) &&
                             ((*local_58 == '\0' ||
                              (iVar8 = strcmp(local_58,pcVar2), iVar7 = iVar12, iVar8 != 0))))
                          goto LAB_0012f238;
                        }
                        goto LAB_0012f2ae;
                      }
LAB_0012f238:
                      sVar10 = strlen(pcVar13);
                      pcVar13 = pcVar13 + (ulong)((uint)sVar10 & 0x3fffffff) + 1;
                    } while ((long)pcVar13 - (long)local_50 < local_78);
                  }
                  if (__s->pMethods != (sqlite3_io_methods *)0x0) {
                    (*__s->pMethods->xClose)(__s);
                    __s->pMethods = (sqlite3_io_methods *)0x0;
                  }
                  if (psVar1->xDelete == (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                    iVar7 = 0;
                    puVar9 = local_70;
                  }
                  else {
                    iVar7 = (*psVar1->xDelete)(psVar1,pcVar2,0);
                    puVar9 = local_70;
                  }
                }
                goto LAB_0012f111;
              }
              iVar7 = 7;
            }
            puVar9 = (undefined4 *)0x0;
          }
          else {
            puVar9 = (undefined4 *)0x0;
          }
LAB_0012f111:
          sqlite3_free(puVar9);
LAB_0012f116:
          if (__s->pMethods != (sqlite3_io_methods *)0x0) {
            (*__s->pMethods->xClose)(__s);
            __s->pMethods = (sqlite3_io_methods *)0x0;
          }
          sqlite3_free(__s);
          goto LAB_0012ed84;
        }
      }
    }
  }
LAB_0012ed7e:
  pPager->changeCountDone = pPager->tempFile;
LAB_0012ed84:
  if ((isHot != 0) && (uVar14 != 0)) {
    sqlite3_log(0x21b,"recovered %d pages from %s",(ulong)uVar14,pPager->zJournal);
  }
  setSectorSize(pPager);
  return iVar7;
}

Assistant:

static int pager_playback(Pager *pPager, int isHot){
  sqlite3_vfs *pVfs = pPager->pVfs;
  i64 szJ;                 /* Size of the journal file in bytes */
  u32 nRec;                /* Number of Records in the journal */
  u32 u;                   /* Unsigned loop counter */
  Pgno mxPg = 0;           /* Size of the original file in pages */
  int rc;                  /* Result code of a subroutine */
  int res = 1;             /* Value returned by sqlite3OsAccess() */
  char *zSuper = 0;        /* Name of super-journal file if any */
  int needPagerReset;      /* True to reset page prior to first page rollback */
  int nPlayback = 0;       /* Total number of pages restored from journal */
  u32 savedPageSize = pPager->pageSize;

  /* Figure out how many records are in the journal.  Abort early if
  ** the journal is empty.
  */
  assert( isOpen(pPager->jfd) );
  rc = sqlite3OsFileSize(pPager->jfd, &szJ);
  if( rc!=SQLITE_OK ){
    goto end_playback;
  }

  /* Read the super-journal name from the journal, if it is present.
  ** If a super-journal file name is specified, but the file is not
  ** present on disk, then the journal is not hot and does not need to be
  ** played back.
  **
  ** TODO: Technically the following is an error because it assumes that
  ** buffer Pager.pTmpSpace is (mxPathname+1) bytes or larger. i.e. that
  ** (pPager->pageSize >= pPager->pVfs->mxPathname+1). Using os_unix.c,
  ** mxPathname is 512, which is the same as the minimum allowable value
  ** for pageSize.
  */
  zSuper = pPager->pTmpSpace;
  rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
  if( rc==SQLITE_OK && zSuper[0] ){
    rc = sqlite3OsAccess(pVfs, zSuper, SQLITE_ACCESS_EXISTS, &res);
  }
  zSuper = 0;
  if( rc!=SQLITE_OK || !res ){
    goto end_playback;
  }
  pPager->journalOff = 0;
  needPagerReset = isHot;

  /* This loop terminates either when a readJournalHdr() or
  ** pager_playback_one_page() call returns SQLITE_DONE or an IO error
  ** occurs.
  */
  while( 1 ){
    /* Read the next journal header from the journal file.  If there are
    ** not enough bytes left in the journal file for a complete header, or
    ** it is corrupted, then a process must have failed while writing it.
    ** This indicates nothing more needs to be rolled back.
    */
    rc = readJournalHdr(pPager, isHot, szJ, &nRec, &mxPg);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_DONE ){
        rc = SQLITE_OK;
      }
      goto end_playback;
    }

    /* If nRec is 0xffffffff, then this journal was created by a process
    ** working in no-sync mode. This means that the rest of the journal
    ** file consists of pages, there are no more journal headers. Compute
    ** the value of nRec based on this assumption.
    */
    if( nRec==0xffffffff ){
      assert( pPager->journalOff==JOURNAL_HDR_SZ(pPager) );
      nRec = (int)((szJ - JOURNAL_HDR_SZ(pPager))/JOURNAL_PG_SZ(pPager));
    }

    /* If nRec is 0 and this rollback is of a transaction created by this
    ** process and if this is the final header in the journal, then it means
    ** that this part of the journal was being filled but has not yet been
    ** synced to disk.  Compute the number of pages based on the remaining
    ** size of the file.
    **
    ** The third term of the test was added to fix ticket #2565.
    ** When rolling back a hot journal, nRec==0 always means that the next
    ** chunk of the journal contains zero pages to be rolled back.  But
    ** when doing a ROLLBACK and the nRec==0 chunk is the last chunk in
    ** the journal, it means that the journal might contain additional
    ** pages that need to be rolled back and that the number of pages
    ** should be computed based on the journal file size.
    */
    if( nRec==0 && !isHot &&
        pPager->journalHdr+JOURNAL_HDR_SZ(pPager)==pPager->journalOff ){
      nRec = (int)((szJ - pPager->journalOff) / JOURNAL_PG_SZ(pPager));
    }

    /* If this is the first header read from the journal, truncate the
    ** database file back to its original size.
    */
    if( pPager->journalOff==JOURNAL_HDR_SZ(pPager) ){
      rc = pager_truncate(pPager, mxPg);
      if( rc!=SQLITE_OK ){
        goto end_playback;
      }
      pPager->dbSize = mxPg;
      if( pPager->mxPgno<mxPg ){
        pPager->mxPgno = mxPg;
      }
    }

    /* Copy original pages out of the journal and back into the
    ** database file and/or page cache.
    */
    for(u=0; u<nRec; u++){
      if( needPagerReset ){
        pager_reset(pPager);
        needPagerReset = 0;
      }
      rc = pager_playback_one_page(pPager,&pPager->journalOff,0,1,0);
      if( rc==SQLITE_OK ){
        nPlayback++;
      }else{
        if( rc==SQLITE_DONE ){
          pPager->journalOff = szJ;
          break;
        }else if( rc==SQLITE_IOERR_SHORT_READ ){
          /* If the journal has been truncated, simply stop reading and
          ** processing the journal. This might happen if the journal was
          ** not completely written and synced prior to a crash.  In that
          ** case, the database should have never been written in the
          ** first place so it is OK to simply abandon the rollback. */
          rc = SQLITE_OK;
          goto end_playback;
        }else{
          /* If we are unable to rollback, quit and return the error
          ** code.  This will cause the pager to enter the error state
          ** so that no further harm will be done.  Perhaps the next
          ** process to come along will be able to rollback the database.
          */
          goto end_playback;
        }
      }
    }
  }
  /*NOTREACHED*/
  assert( 0 );

end_playback:
  if( rc==SQLITE_OK ){
    rc = sqlite3PagerSetPagesize(pPager, &savedPageSize, -1);
  }
  /* Following a rollback, the database file should be back in its original
  ** state prior to the start of the transaction, so invoke the
  ** SQLITE_FCNTL_DB_UNCHANGED file-control method to disable the
  ** assertion that the transaction counter was modified.
  */
#ifdef SQLITE_DEBUG
  sqlite3OsFileControlHint(pPager->fd,SQLITE_FCNTL_DB_UNCHANGED,0);
#endif

  /* If this playback is happening automatically as a result of an IO or
  ** malloc error that occurred after the change-counter was updated but
  ** before the transaction was committed, then the change-counter
  ** modification may just have been reverted. If this happens in exclusive
  ** mode, then subsequent transactions performed by the connection will not
  ** update the change-counter at all. This may lead to cache inconsistency
  ** problems for other processes at some point in the future. So, just
  ** in case this has happened, clear the changeCountDone flag now.
  */
  pPager->changeCountDone = pPager->tempFile;

  if( rc==SQLITE_OK ){
    /* Leave 4 bytes of space before the super-journal filename in memory.
    ** This is because it may end up being passed to sqlite3OsOpen(), in
    ** which case it requires 4 0x00 bytes in memory immediately before
    ** the filename. */
    zSuper = &pPager->pTmpSpace[4];
    rc = readSuperJournal(pPager->jfd, zSuper, pPager->pVfs->mxPathname+1);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK
   && (pPager->eState>=PAGER_WRITER_DBMOD || pPager->eState==PAGER_OPEN)
  ){
    rc = sqlite3PagerSync(pPager, 0);
  }
  if( rc==SQLITE_OK ){
    rc = pager_end_transaction(pPager, zSuper[0]!='\0', 0);
    testcase( rc!=SQLITE_OK );
  }
  if( rc==SQLITE_OK && zSuper[0] && res ){
    /* If there was a super-journal and this routine will return success,
    ** see if it is possible to delete the super-journal.
    */
    assert( zSuper==&pPager->pTmpSpace[4] );
    memset(&zSuper[-4], 0, 4);
    rc = pager_delsuper(pPager, zSuper);
    testcase( rc!=SQLITE_OK );
  }
  if( isHot && nPlayback ){
    sqlite3_log(SQLITE_NOTICE_RECOVER_ROLLBACK, "recovered %d pages from %s",
                nPlayback, pPager->zJournal);
  }

  /* The Pager.sectorSize variable may have been updated while rolling
  ** back a journal created by a process with a different sector size
  ** value. Reset it to the correct value for this process.
  */
  setSectorSize(pPager);
  return rc;
}